

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cavalry.hpp
# Opt level: O1

void __thiscall Cavalry::~Cavalry(Cavalry *this)

{
  ~Cavalry(this);
  operator_delete(this,0x158);
  return;
}

Assistant:

~Cavalry() {}